

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  int iVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  sVar2 = this->exponent_;
  iVar6 = (int)sVar2;
  uVar4 = (uint)other->exponent_;
  if (other->exponent_ < sVar2) {
    iVar7 = iVar6 - uVar4;
    sVar3 = this->used_bigits_;
    iVar1 = iVar7 + sVar3;
    if (0x80 < iVar1) {
      abort();
    }
    if (0 < sVar3) {
      uVar5 = (long)(int)sVar3 + 1;
      do {
        *(Chunk *)((long)this + uVar5 * 4 + (long)iVar6 * 4 + (long)(int)uVar4 * -4 + -4) =
             this->bigits_buffer_[uVar5 - 2];
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
    if (0 < iVar7) {
      memset(this->bigits_buffer_,0,(ulong)(~uVar4 + iVar6) * 4 + 4);
    }
    this->used_bigits_ = (int16_t)iVar1;
    this->exponent_ = sVar2 - (short)iVar7;
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" bigit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    const int zero_bigits = exponent_ - other.exponent_;
    EnsureCapacity(used_bigits_ + zero_bigits);
    for (int i = used_bigits_ - 1; i >= 0; --i) {
      RawBigit(i + zero_bigits) = RawBigit(i);
    }
    for (int i = 0; i < zero_bigits; ++i) {
      RawBigit(i) = 0;
    }
    used_bigits_ += static_cast<int16_t>(zero_bigits);
    exponent_ -= static_cast<int16_t>(zero_bigits);

    DOUBLE_CONVERSION_ASSERT(used_bigits_ >= 0);
    DOUBLE_CONVERSION_ASSERT(exponent_ >= 0);
  }
}